

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

void CopyState(pyhanabi_state_t *src,pyhanabi_state_t *dest)

{
  HanabiState *state;
  HanabiState *this;
  
  if (src == (pyhanabi_state_t *)0x0) {
    __assert_fail("src != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,300,"void CopyState(const pyhanabi_state_t *, pyhanabi_state_t *)");
  }
  state = (HanabiState *)src->state;
  if (state != (HanabiState *)0x0) {
    if (dest != (pyhanabi_state_t *)0x0) {
      this = (HanabiState *)operator_new(0xa0);
      hanabi_learning_env::HanabiState::HanabiState(this,state);
      dest->state = this;
      return;
    }
    __assert_fail("dest != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x12e,"void CopyState(const pyhanabi_state_t *, pyhanabi_state_t *)");
  }
  __assert_fail("src->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x12d,"void CopyState(const pyhanabi_state_t *, pyhanabi_state_t *)");
}

Assistant:

void CopyState(const pyhanabi_state_t* src, pyhanabi_state_t* dest) {
  REQUIRE(src != nullptr);
  REQUIRE(src->state != nullptr);
  REQUIRE(dest != nullptr);
  dest->state = new hanabi_learning_env::HanabiState(
      *static_cast<hanabi_learning_env::HanabiState*>(src->state));
}